

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothubtransporthttp.c
# Opt level: O1

HTTP_HEADERS_RESULT
addUserAgentHeaderInfo
          (HTTPTRANSPORT_HANDLE_DATA *transport_data,HTTP_HEADERS_HANDLE eventHTTPrequestHeaders)

{
  HTTP_HEADERS_RESULT HVar1;
  char *pcVar2;
  char *value;
  
  pcVar2 = (*(transport_data->transport_callbacks).prod_info_cb)(transport_data->transport_ctx);
  value = "iothubclient/1.15.0";
  if (pcVar2 != (char *)0x0) {
    value = pcVar2;
  }
  HVar1 = HTTPHeaders_AddHeaderNameValuePair(eventHTTPrequestHeaders,"User-Agent",value);
  return HVar1;
}

Assistant:

static HTTP_HEADERS_RESULT addUserAgentHeaderInfo(HTTPTRANSPORT_HANDLE_DATA* transport_data, HTTP_HEADERS_HANDLE eventHTTPrequestHeaders)
{
    HTTP_HEADERS_RESULT result;
    const char* product_info = transport_data->transport_callbacks.prod_info_cb(transport_data->transport_ctx);
    if (product_info == NULL)
    {
        result = HTTPHeaders_AddHeaderNameValuePair(eventHTTPrequestHeaders, "User-Agent", CLIENT_DEVICE_TYPE_PREFIX CLIENT_DEVICE_BACKSLASH IOTHUB_SDK_VERSION);
    }
    else
    {
        result = HTTPHeaders_AddHeaderNameValuePair(eventHTTPrequestHeaders, "User-Agent", product_info);
    }
    return result;
}